

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

int re2::Regexp::FactorAlternation(Regexp **sub,int nsub,ParseFlags flags)

{
  uint uVar1;
  vector<re2::Splice,_std::allocator<re2::Splice>_> *splices;
  pointer pSVar2;
  Regexp **ppRVar3;
  pointer pFVar4;
  long lVar5;
  Regexp *pRVar6;
  ulong uVar7;
  ostream *poVar8;
  int iVar9;
  ParseFlags flags_00;
  pointer extraout_RDX;
  ulong uVar10;
  pointer extraout_RDX_00;
  long lVar11;
  ulong extraout_RDX_01;
  pointer pSVar12;
  long lVar13;
  int iVar14;
  int nsuffix;
  uint uVar15;
  ulong uVar16;
  vector<re2::Frame,_std::allocator<re2::Frame>_> stk;
  int nsub_local;
  Regexp **sub_local;
  Regexp *re [2];
  
  stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  nsub_local = nsub;
  sub_local = sub;
  std::vector<re2::Frame,std::allocator<re2::Frame>>::emplace_back<re2::Regexp**&,int&>
            ((vector<re2::Frame,std::allocator<re2::Frame>> *)&stk,&sub_local,&nsub_local);
  pSVar12 = extraout_RDX;
LAB_001dcfd9:
  do {
    pFVar4 = stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
             super__Vector_impl_data._M_finish;
    flags_00 = (ParseFlags)pSVar12;
    pSVar12 = stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].splices.
              super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar2 = stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].splices.
             super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar12 != pSVar2) {
      iVar14 = stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].spliceidx;
      lVar5 = (long)pSVar2 - (long)pSVar12;
      uVar10 = lVar5 % 0x18;
      if (iVar14 < (int)(lVar5 / 0x18)) {
        std::vector<re2::Frame,std::allocator<re2::Frame>>::emplace_back<re2::Regexp**&,int&>
                  ((vector<re2::Frame,std::allocator<re2::Frame>> *)&stk,&pSVar12[iVar14].sub,
                   &pSVar12[iVar14].nsub);
        pSVar12 = extraout_RDX_00;
        goto LAB_001dcfd9;
      }
      uVar16 = 0;
      uVar7 = 0;
      while( true ) {
        flags_00 = (ParseFlags)uVar10;
        uVar15 = (uint)uVar16;
        if (pFVar4[-1].nsub <= (int)uVar7) break;
        lVar5 = (long)(int)uVar15;
        lVar11 = (long)(int)uVar7 << 3;
        lVar13 = lVar5 << 0x20;
        uVar7 = uVar7 & 0xffffffff;
        while( true ) {
          uVar15 = uVar15 + 1;
          uVar16 = (ulong)uVar15;
          ppRVar3 = pFVar4[-1].sub;
          iVar14 = (int)uVar7;
          if (pSVar12->sub <= (Regexp **)((long)ppRVar3 + lVar11)) break;
          ppRVar3[lVar5] = *(Regexp **)((long)ppRVar3 + lVar11);
          lVar5 = lVar5 + 1;
          uVar7 = (ulong)(iVar14 + 1);
          lVar11 = lVar11 + 8;
          lVar13 = lVar13 + 0x100000000;
        }
        uVar1 = pFVar4[-1].round - 1;
        uVar10 = (ulong)uVar1;
        if (uVar1 < 2) {
          re[0] = pSVar12->prefix;
          re[1] = AlternateNoFactor(pSVar12->sub,pSVar12->nsuffix,flags);
          pRVar6 = Concat(re,2,flags);
          *(Regexp **)((long)pFVar4[-1].sub + (lVar13 >> 0x1d)) = pRVar6;
          iVar9 = pSVar12->nsub;
          uVar10 = extraout_RDX_01;
        }
        else {
          if (pFVar4[-1].round != 3) {
            LogMessage::LogMessage
                      ((LogMessage *)re,
                       "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/parse.cc"
                       ,0x3d3);
            poVar8 = std::operator<<((ostream *)(re + 1),"unknown round: ");
            std::ostream::operator<<(poVar8,pFVar4[-1].round);
            goto LAB_001dd2b4;
          }
          *(Regexp **)((long)ppRVar3 + (lVar13 >> 0x1d)) = pSVar12->prefix;
          iVar9 = pSVar12->nsub;
        }
        uVar7 = (ulong)(uint)(iVar9 + iVar14);
        pSVar12 = pSVar12 + 1;
        if (pSVar12 ==
            pFVar4[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl
            .super__Vector_impl_data._M_finish) {
          uVar10 = (ulong)pFVar4[-1].nsub;
          uVar16 = (ulong)(int)uVar15;
          for (uVar7 = (ulong)(iVar9 + iVar14); (long)uVar7 < (long)uVar10; uVar7 = uVar7 + 1) {
            pFVar4[-1].sub[uVar16] = pFVar4[-1].sub[uVar7];
            uVar16 = uVar16 + 1;
          }
        }
      }
      pSVar12 = pFVar4[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pFVar4[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
          super__Vector_impl_data._M_finish != pSVar12) {
        pFVar4[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar12;
      }
      pFVar4[-1].nsub = uVar15;
    }
    uVar15 = pFVar4[-1].round;
    pFVar4[-1].round = uVar15 + 1;
    if (3 < uVar15) {
      LogMessage::LogMessage
                ((LogMessage *)re,
                 "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O2/_deps/re2-src/re2/parse.cc"
                 ,0x3fa);
      poVar8 = std::operator<<((ostream *)(re + 1),"unknown round: ");
      std::ostream::operator<<(poVar8,pFVar4[-1].round);
LAB_001dd2b4:
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)re);
    }
    splices = &pFVar4[-1].splices;
    switch(uVar15) {
    case 0:
      FactorAlternationImpl::Round1(pFVar4[-1].sub,pFVar4[-1].nsub,flags_00,splices);
      break;
    case 1:
      FactorAlternationImpl::Round2(pFVar4[-1].sub,pFVar4[-1].nsub,flags_00,splices);
      break;
    case 2:
      FactorAlternationImpl::Round3(pFVar4[-1].sub,pFVar4[-1].nsub,flags,splices);
      break;
    case 3:
      goto switchD_001dd174_caseD_3;
    }
    pSVar12 = pFVar4[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pSVar2 = pFVar4[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((pSVar12 == pSVar2) || (iVar14 = 0, pFVar4[-1].round == 3)) {
      lVar5 = (long)pSVar2 - (long)pSVar12;
      pSVar12 = (pointer)(lVar5 % 0x18);
      iVar14 = (int)(lVar5 / 0x18);
    }
    pFVar4[-1].spliceidx = iVar14;
  } while( true );
switchD_001dd174_caseD_3:
  iVar14 = pFVar4[-1].nsub;
  if ((long)stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_start == 0x30) {
    std::vector<re2::Frame,_std::allocator<re2::Frame>_>::~vector(&stk);
    return iVar14;
  }
  pFVar4 = stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.super__Vector_impl_data.
  _M_finish = stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
  std::_Vector_base<re2::Splice,_std::allocator<re2::Splice>_>::~_Vector_base
            (&(pFVar4->splices).super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>);
  iVar9 = stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].spliceidx;
  pSVar12 = stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].splices.
            super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar12[iVar9].nsuffix = iVar14;
  stk.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.super__Vector_impl_data.
  _M_finish[-1].spliceidx = iVar9 + 1;
  goto LAB_001dcfd9;
}

Assistant:

int Regexp::FactorAlternation(Regexp** sub, int nsub, ParseFlags flags) {
  std::vector<Frame> stk;
  stk.emplace_back(sub, nsub);

  for (;;) {
    auto& sub = stk.back().sub;
    auto& nsub = stk.back().nsub;
    auto& round = stk.back().round;
    auto& splices = stk.back().splices;
    auto& spliceidx = stk.back().spliceidx;

    if (splices.empty()) {
      // Advance to the next round of factoring. Note that this covers
      // the initialised state: when splices is empty and round is 0.
      round++;
    } else if (spliceidx < static_cast<int>(splices.size())) {
      // We have at least one more Splice to factor. Recurse logically.
      stk.emplace_back(splices[spliceidx].sub, splices[spliceidx].nsub);
      continue;
    } else {
      // We have no more Splices to factor. Apply them.
      auto iter = splices.begin();
      int out = 0;
      for (int i = 0; i < nsub; ) {
        // Copy until we reach where the next Splice begins.
        while (sub + i < iter->sub)
          sub[out++] = sub[i++];
        switch (round) {
          case 1:
          case 2: {
            // Assemble the Splice prefix and the suffixes.
            Regexp* re[2];
            re[0] = iter->prefix;
            re[1] = Regexp::AlternateNoFactor(iter->sub, iter->nsuffix, flags);
            sub[out++] = Regexp::Concat(re, 2, flags);
            i += iter->nsub;
            break;
          }
          case 3:
            // Just use the Splice prefix.
            sub[out++] = iter->prefix;
            i += iter->nsub;
            break;
          default:
            LOG(DFATAL) << "unknown round: " << round;
            break;
        }
        // If we are done, copy until the end of sub.
        if (++iter == splices.end()) {
          while (i < nsub)
            sub[out++] = sub[i++];
        }
      }
      splices.clear();
      nsub = out;
      // Advance to the next round of factoring.
      round++;
    }

    switch (round) {
      case 1:
        FactorAlternationImpl::Round1(sub, nsub, flags, &splices);
        break;
      case 2:
        FactorAlternationImpl::Round2(sub, nsub, flags, &splices);
        break;
      case 3:
        FactorAlternationImpl::Round3(sub, nsub, flags, &splices);
        break;
      case 4:
        if (stk.size() == 1) {
          // We are at the top of the stack. Just return.
          return nsub;
        } else {
          // Pop the stack and set the number of suffixes.
          // (Note that references will be invalidated!)
          int nsuffix = nsub;
          stk.pop_back();
          stk.back().splices[stk.back().spliceidx].nsuffix = nsuffix;
          ++stk.back().spliceidx;
          continue;
        }
      default:
        LOG(DFATAL) << "unknown round: " << round;
        break;
    }

    // Set spliceidx depending on whether we have Splices to factor.
    if (splices.empty() || round == 3) {
      spliceidx = static_cast<int>(splices.size());
    } else {
      spliceidx = 0;
    }
  }
}